

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O3

bool __thiscall
node::BlockManager::UndoReadFromDisk(BlockManager *this,CBlockUndo *blockundo,CBlockIndex *index)

{
  long lVar1;
  uint256 *puVar2;
  size_t __nbytes;
  bool bVar3;
  _Alloc_hider _Var4;
  FlatFilePos FVar5;
  long in_FS_OFFSET;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  FlatFilePos pos;
  VectorFormatter<DefaultFormatter> local_109;
  AutoFile filein;
  string local_d8;
  HashVerifier<AutoFile> verifier;
  uint256 hashChecksum;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  verifier.super_HashWriter.ctx.s._0_8_ = &cs_main;
  verifier.super_HashWriter.ctx.s[2]._0_1_ = 0;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&verifier);
  FVar5.nFile = -(uint)((index->nStatus & 0x10) == 0) | index->nFile;
  FVar5.nPos = (int)(index->nStatus << 0x1b) >> 0x1f & index->nUndoPos;
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)&verifier);
  __nbytes = 1;
  pos = FVar5;
  OpenUndoFile(&filein,this,&pos,true);
  if (filein.m_file == (FILE *)0x0) {
    FlatFilePos::ToString_abi_cxx11_((string *)&verifier,&pos);
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/blockstorage.cpp"
    ;
    source_file_00._M_len = 0x65;
    logging_function_00._M_str = "UndoReadFromDisk";
    logging_function_00._M_len = 0x10;
    LogPrintFormatInternal<char[17],std::__cxx11::string>
              (logging_function_00,source_file_00,0x2c2,ALL,Error,
               (ConstevalFormatString<2U>)0xf7e5fa,(char (*) [17])"UndoReadFromDisk",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&verifier);
    _Var4._M_p = (pointer)verifier.super_HashWriter.ctx.s._0_8_;
    if ((uint32_t *)verifier.super_HashWriter.ctx.s._0_8_ != verifier.super_HashWriter.ctx.s + 4) {
LAB_00912dde:
      operator_delete(_Var4._M_p,verifier.super_HashWriter.ctx.s._16_8_ + 1);
    }
  }
  else {
    hashChecksum.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    CSHA256::CSHA256((CSHA256 *)&verifier);
    puVar2 = index->pprev->phashBlock;
    verifier.m_source = &filein;
    if (puVar2 == (uint256 *)0x0) {
      __assert_fail("phashBlock != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/chain.h"
                    ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
    }
    local_d8._M_dataplus._M_p = *(pointer *)(puVar2->super_base_blob<256U>).m_data._M_elems;
    local_d8._M_string_length = *(size_type *)((puVar2->super_base_blob<256U>).m_data._M_elems + 8);
    local_d8.field_2._M_allocated_capacity =
         *(undefined8 *)((puVar2->super_base_blob<256U>).m_data._M_elems + 0x10);
    local_d8.field_2._8_8_ = *(undefined8 *)((puVar2->super_base_blob<256U>).m_data._M_elems + 0x18)
    ;
    CSHA256::Write((CSHA256 *)&verifier,(uchar *)&local_d8,0x20);
    VectorFormatter<DefaultFormatter>::
    Unser<HashVerifier<AutoFile>,std::vector<CTxUndo,std::allocator<CTxUndo>>>
              (&local_109,&verifier,&blockundo->vtxundo);
    AutoFile::read(&filein,(int)&hashChecksum,(void *)0x20,__nbytes);
    HashWriter::GetHash((uint256 *)&local_d8,&verifier.super_HashWriter);
    auVar7[0] = -(local_d8.field_2._M_local_buf[0] ==
                 hashChecksum.super_base_blob<256U>.m_data._M_elems[0x10]);
    auVar7[1] = -(local_d8.field_2._M_local_buf[1] ==
                 hashChecksum.super_base_blob<256U>.m_data._M_elems[0x11]);
    auVar7[2] = -(local_d8.field_2._M_local_buf[2] ==
                 hashChecksum.super_base_blob<256U>.m_data._M_elems[0x12]);
    auVar7[3] = -(local_d8.field_2._M_local_buf[3] ==
                 hashChecksum.super_base_blob<256U>.m_data._M_elems[0x13]);
    auVar7[4] = -(local_d8.field_2._M_local_buf[4] ==
                 hashChecksum.super_base_blob<256U>.m_data._M_elems[0x14]);
    auVar7[5] = -(local_d8.field_2._M_local_buf[5] ==
                 hashChecksum.super_base_blob<256U>.m_data._M_elems[0x15]);
    auVar7[6] = -(local_d8.field_2._M_local_buf[6] ==
                 hashChecksum.super_base_blob<256U>.m_data._M_elems[0x16]);
    auVar7[7] = -(local_d8.field_2._M_local_buf[7] ==
                 hashChecksum.super_base_blob<256U>.m_data._M_elems[0x17]);
    auVar7[8] = -(local_d8.field_2._M_local_buf[8] ==
                 hashChecksum.super_base_blob<256U>.m_data._M_elems[0x18]);
    auVar7[9] = -(local_d8.field_2._M_local_buf[9] ==
                 hashChecksum.super_base_blob<256U>.m_data._M_elems[0x19]);
    auVar7[10] = -(local_d8.field_2._M_local_buf[10] ==
                  hashChecksum.super_base_blob<256U>.m_data._M_elems[0x1a]);
    auVar7[0xb] = -(local_d8.field_2._M_local_buf[0xb] ==
                   hashChecksum.super_base_blob<256U>.m_data._M_elems[0x1b]);
    auVar7[0xc] = -(local_d8.field_2._M_local_buf[0xc] ==
                   hashChecksum.super_base_blob<256U>.m_data._M_elems[0x1c]);
    auVar7[0xd] = -(local_d8.field_2._M_local_buf[0xd] ==
                   hashChecksum.super_base_blob<256U>.m_data._M_elems[0x1d]);
    auVar7[0xe] = -(local_d8.field_2._M_local_buf[0xe] ==
                   hashChecksum.super_base_blob<256U>.m_data._M_elems[0x1e]);
    auVar7[0xf] = -(local_d8.field_2._M_local_buf[0xf] ==
                   hashChecksum.super_base_blob<256U>.m_data._M_elems[0x1f]);
    auVar6[0] = -((uchar)local_d8._M_dataplus._M_p ==
                 hashChecksum.super_base_blob<256U>.m_data._M_elems[0]);
    auVar6[1] = -(local_d8._M_dataplus._M_p._1_1_ ==
                 hashChecksum.super_base_blob<256U>.m_data._M_elems[1]);
    auVar6[2] = -(local_d8._M_dataplus._M_p._2_1_ ==
                 hashChecksum.super_base_blob<256U>.m_data._M_elems[2]);
    auVar6[3] = -(local_d8._M_dataplus._M_p._3_1_ ==
                 hashChecksum.super_base_blob<256U>.m_data._M_elems[3]);
    auVar6[4] = -(local_d8._M_dataplus._M_p._4_1_ ==
                 hashChecksum.super_base_blob<256U>.m_data._M_elems[4]);
    auVar6[5] = -(local_d8._M_dataplus._M_p._5_1_ ==
                 hashChecksum.super_base_blob<256U>.m_data._M_elems[5]);
    auVar6[6] = -(local_d8._M_dataplus._M_p._6_1_ ==
                 hashChecksum.super_base_blob<256U>.m_data._M_elems[6]);
    auVar6[7] = -(local_d8._M_dataplus._M_p._7_1_ ==
                 hashChecksum.super_base_blob<256U>.m_data._M_elems[7]);
    auVar6[8] = -((uchar)local_d8._M_string_length ==
                 hashChecksum.super_base_blob<256U>.m_data._M_elems[8]);
    auVar6[9] = -(local_d8._M_string_length._1_1_ ==
                 hashChecksum.super_base_blob<256U>.m_data._M_elems[9]);
    auVar6[10] = -(local_d8._M_string_length._2_1_ ==
                  hashChecksum.super_base_blob<256U>.m_data._M_elems[10]);
    auVar6[0xb] = -(local_d8._M_string_length._3_1_ ==
                   hashChecksum.super_base_blob<256U>.m_data._M_elems[0xb]);
    auVar6[0xc] = -(local_d8._M_string_length._4_1_ ==
                   hashChecksum.super_base_blob<256U>.m_data._M_elems[0xc]);
    auVar6[0xd] = -(local_d8._M_string_length._5_1_ ==
                   hashChecksum.super_base_blob<256U>.m_data._M_elems[0xd]);
    auVar6[0xe] = -(local_d8._M_string_length._6_1_ ==
                   hashChecksum.super_base_blob<256U>.m_data._M_elems[0xe]);
    auVar6[0xf] = -(local_d8._M_string_length._7_1_ ==
                   hashChecksum.super_base_blob<256U>.m_data._M_elems[0xf]);
    auVar6 = auVar6 & auVar7;
    if ((ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) | (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar6 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar6[0xf] >> 7) << 0xf) == 0xffff) {
      bVar3 = true;
      goto LAB_00912dec;
    }
    FlatFilePos::ToString_abi_cxx11_(&local_d8,&pos);
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/blockstorage.cpp"
    ;
    source_file._M_len = 0x65;
    logging_function._M_str = "UndoReadFromDisk";
    logging_function._M_len = 0x10;
    LogPrintFormatInternal<char[17],std::__cxx11::string>
              (logging_function,source_file,0x2d4,ALL,Error,(ConstevalFormatString<2U>)0xf7e643,
               (char (*) [17])"UndoReadFromDisk",&local_d8);
    verifier.super_HashWriter.ctx.s._16_8_ = local_d8.field_2._M_allocated_capacity;
    _Var4._M_p = local_d8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) goto LAB_00912dde;
  }
  bVar3 = false;
LAB_00912dec:
  AutoFile::~AutoFile(&filein);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool BlockManager::UndoReadFromDisk(CBlockUndo& blockundo, const CBlockIndex& index) const
{
    const FlatFilePos pos{WITH_LOCK(::cs_main, return index.GetUndoPos())};

    // Open history file to read
    AutoFile filein{OpenUndoFile(pos, true)};
    if (filein.IsNull()) {
        LogError("%s: OpenUndoFile failed for %s\n", __func__, pos.ToString());
        return false;
    }

    // Read block
    uint256 hashChecksum;
    HashVerifier verifier{filein}; // Use HashVerifier as reserializing may lose data, c.f. commit d342424301013ec47dc146a4beb49d5c9319d80a
    try {
        verifier << index.pprev->GetBlockHash();
        verifier >> blockundo;
        filein >> hashChecksum;
    } catch (const std::exception& e) {
        LogError("%s: Deserialize or I/O error - %s at %s\n", __func__, e.what(), pos.ToString());
        return false;
    }

    // Verify checksum
    if (hashChecksum != verifier.GetHash()) {
        LogError("%s: Checksum mismatch at %s\n", __func__, pos.ToString());
        return false;
    }

    return true;
}